

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_cHRM(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  png_byte buf [32];
  png_xy xy;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if (length == 0x20) {
      png_crc_read(png_ptr,buf,0x20);
      iVar2 = png_crc_finish(png_ptr,0);
      if (iVar2 != 0) {
        return;
      }
      xy.bluey = 0xffffffff;
      xy.whitex = xy.bluey;
      if (-1 < (int)(buf._0_4_ << 0x18)) {
        xy.whitex = (uint)buf._0_4_ >> 0x18 | ((uint)buf._0_4_ >> 8 & 0xff) << 0x10 |
                    ((uint)buf._0_4_ >> 0x10 & 0xff) << 8 | buf._0_4_ << 0x18;
      }
      xy.whitey = xy.bluey;
      if (-1 < (int)(buf._4_4_ << 0x18)) {
        xy.whitey = (uint)buf._4_4_ >> 0x18 | ((uint)buf._4_4_ >> 8 & 0xff) << 0x10 |
                    ((uint)buf._4_4_ >> 0x10 & 0xff) << 8 | buf._4_4_ << 0x18;
      }
      xy.redx = xy.bluey;
      if (-1 < (int)(buf._8_4_ << 0x18)) {
        xy.redx = (uint)buf._8_4_ >> 0x18 | ((uint)buf._8_4_ >> 8 & 0xff) << 0x10 |
                  ((uint)buf._8_4_ >> 0x10 & 0xff) << 8 | buf._8_4_ << 0x18;
      }
      xy.redy = xy.bluey;
      if (-1 < (int)(buf._12_4_ << 0x18)) {
        xy.redy = (uint)buf._12_4_ >> 0x18 | ((uint)buf._12_4_ >> 8 & 0xff) << 0x10 |
                  ((uint)buf._12_4_ >> 0x10 & 0xff) << 8 | buf._12_4_ << 0x18;
      }
      xy.greenx = xy.bluey;
      if (-1 < (int)(buf._16_4_ << 0x18)) {
        xy.greenx = (uint)buf._16_4_ >> 0x18 | ((uint)buf._16_4_ >> 8 & 0xff) << 0x10 |
                    ((uint)buf._16_4_ >> 0x10 & 0xff) << 8 | buf._16_4_ << 0x18;
      }
      xy.greeny = xy.bluey;
      if (-1 < (int)(buf._20_4_ << 0x18)) {
        xy.greeny = (uint)buf._20_4_ >> 0x18 | ((uint)buf._20_4_ >> 8 & 0xff) << 0x10 |
                    ((uint)buf._20_4_ >> 0x10 & 0xff) << 8 | buf._20_4_ << 0x18;
      }
      xy.bluex = xy.bluey;
      if (-1 < (int)(buf._24_4_ << 0x18)) {
        xy.bluex = (uint)buf._24_4_ >> 0x18 | ((uint)buf._24_4_ >> 8 & 0xff) << 0x10 |
                   ((uint)buf._24_4_ >> 0x10 & 0xff) << 8 | buf._24_4_ << 0x18;
      }
      if (-1 < (int)(buf._28_4_ << 0x18)) {
        xy.bluey = (uint)buf._28_4_ >> 0x18 | ((uint)buf._28_4_ >> 8 & 0xff) << 0x10 |
                   ((uint)buf._28_4_ >> 0x10 & 0xff) << 8 | buf._28_4_ << 0x18;
      }
      if (((((xy.whitex == 0xffffffff) || (xy.whitey == 0xffffffff)) || (xy.redx == 0xffffffff)) ||
          ((xy.redy == 0xffffffff || (xy.greenx == 0xffffffff)))) ||
         ((xy.greeny == 0xffffffff || ((xy.bluex == 0xffffffff || (xy.bluey == 0xffffffff)))))) {
        pcVar3 = "invalid values";
      }
      else {
        uVar1 = (png_ptr->colorspace).flags;
        if ((short)uVar1 < 0) {
          return;
        }
        if ((uVar1 & 0x10) == 0) {
          (png_ptr->colorspace).flags = uVar1 | 0x10;
          png_colorspace_set_chromaticities(png_ptr,&png_ptr->colorspace,&xy,1);
          png_colorspace_sync(png_ptr,info_ptr);
          return;
        }
        (png_ptr->colorspace).flags = uVar1 | 0x8000;
        png_colorspace_sync(png_ptr,info_ptr);
        pcVar3 = "duplicate";
      }
      png_chunk_benign_error(png_ptr,pcVar3);
      return;
    }
    png_crc_finish(png_ptr,length);
    pcVar3 = "invalid";
  }
  else {
    png_crc_finish(png_ptr,length);
    pcVar3 = "out of place";
  }
  png_chunk_benign_error(png_ptr,pcVar3);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_cHRM(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[32];
   png_xy xy;

   png_debug(1, "in png_handle_cHRM");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (length != 32)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 32);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   xy.whitex = png_get_fixed_point(NULL, buf);
   xy.whitey = png_get_fixed_point(NULL, buf + 4);
   xy.redx   = png_get_fixed_point(NULL, buf + 8);
   xy.redy   = png_get_fixed_point(NULL, buf + 12);
   xy.greenx = png_get_fixed_point(NULL, buf + 16);
   xy.greeny = png_get_fixed_point(NULL, buf + 20);
   xy.bluex  = png_get_fixed_point(NULL, buf + 24);
   xy.bluey  = png_get_fixed_point(NULL, buf + 28);

   if (xy.whitex == PNG_FIXED_ERROR ||
       xy.whitey == PNG_FIXED_ERROR ||
       xy.redx   == PNG_FIXED_ERROR ||
       xy.redy   == PNG_FIXED_ERROR ||
       xy.greenx == PNG_FIXED_ERROR ||
       xy.greeny == PNG_FIXED_ERROR ||
       xy.bluex  == PNG_FIXED_ERROR ||
       xy.bluey  == PNG_FIXED_ERROR)
   {
      png_chunk_benign_error(png_ptr, "invalid values");
      return;
   }

   /* If a colorspace error has already been output skip this chunk */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) != 0)
      return;

   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_FROM_cHRM) != 0)
   {
      png_ptr->colorspace.flags |= PNG_COLORSPACE_INVALID;
      png_colorspace_sync(png_ptr, info_ptr);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   png_ptr->colorspace.flags |= PNG_COLORSPACE_FROM_cHRM;
   (void)png_colorspace_set_chromaticities(png_ptr, &png_ptr->colorspace, &xy,
       1/*prefer cHRM values*/);
   png_colorspace_sync(png_ptr, info_ptr);
}